

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_dry_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  size_t i;
  pointer piVar1;
  ring_buffer<int> *prVar2;
  int iVar3;
  int iVar4;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> it_1;
  uint *puVar5;
  int *piVar6;
  uint *puVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> _Var10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  *p_Var15;
  int iVar16;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> it;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> _Var17
  ;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  __node_type *p_Var21;
  float fVar22;
  double dVar23;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>_>
  pVar24;
  llama_token token;
  uint local_ac;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> local_a8
  ;
  size_t local_a0;
  ring_buffer<int> *local_98;
  ulong local_90;
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  *local_88;
  ulong local_80;
  uint *local_78;
  ulong local_70;
  llama_token_data_array *local_68;
  long local_60;
  vector<int,_std::allocator<int>_> *local_58;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  uint local_48;
  uint local_44;
  ulong local_40;
  size_type local_38;
  
  local_68 = cur_p;
  puVar5 = (uint *)smpl->ctx;
  if (((((float)puVar5[1] != 0.0) || (NAN((float)puVar5[1]))) &&
      (1.0 < (float)puVar5[2] || (float)puVar5[2] == 1.0)) && (uVar13 = puVar5[4], uVar13 != 0)) {
    puVar7 = puVar5;
    if (uVar13 != 0xffffffff) {
      local_ac = 0;
      puVar7 = puVar5 + 4;
      if ((int)uVar13 < 0) {
        puVar7 = &local_ac;
      }
    }
    uVar13 = puVar5[0x2a];
    if ((int)*puVar7 < (int)puVar5[0x2a]) {
      uVar13 = *puVar7;
    }
    if ((int)*puVar5 < (int)uVar13) {
      uVar13 = *puVar5;
    }
    uVar14 = (ulong)uVar13;
    if ((int)puVar5[3] < (int)uVar13) {
      local_98 = (ring_buffer<int> *)(puVar5 + 0x28);
      local_58 = (vector<int,_std::allocator<int>_> *)(puVar5 + 0x14);
      local_38 = (size_type)(int)uVar13;
      local_ac = 0;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (local_58,local_38,(value_type_conflict3 *)&local_ac);
      local_50 = (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(puVar5 + 0x1a);
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(local_50);
      local_80 = uVar14;
      local_78 = puVar5;
      if (0 < (int)uVar13) {
        local_88 = (_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                    *)(puVar5 + 6);
        local_a0 = 0xffffffffffffffff;
        uVar20 = 0;
        local_90 = uVar14;
        do {
          puVar5 = (uint *)ring_buffer<int>::rat(local_98,uVar20);
          local_ac = *puVar5;
          pVar24 = std::
                   _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   ::equal_range(local_88,(key_type *)&local_ac);
          if ((_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
               )pVar24.first.
                super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                ._M_cur !=
              pVar24.second.
              super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
              ._M_cur.
              super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
              && (__node_type *)
                 pVar24.first.
                 super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                 ._M_cur != (__node_type *)0x0) {
            uVar13 = 0xffffffff;
            local_a8 = pVar24.second.
                       super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                       ._M_cur.
                       super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
            ;
            local_70 = uVar20;
            do {
              _Var10._M_cur =
                   (__node_type *)
                   pVar24.second.
                   super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                   ._M_cur;
              _Var17 = pVar24.first.
                       super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                       ._M_cur;
              uVar12 = (uint)(*(ulong *)((long)_Var17.
                                               super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                               ._M_cur + 0x18) -
                              *(ulong *)((long)_Var17.
                                               super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                               ._M_cur + 0x10) >> 2);
              uVar11 = uVar13;
              if ((((int)uVar13 < (int)uVar12) && ((long)(int)uVar12 <= (long)uVar20)) &&
                 (uVar11 = uVar12, 0 < (int)uVar12)) {
                local_60 = CONCAT44(local_60._4_4_,uVar13);
                uVar14 = 0;
                sVar19 = local_a0;
                do {
                  iVar16 = *(int *)(*(ulong *)((long)_Var17.
                                                  super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                                  ._M_cur + 0x10) + uVar14 * 4);
                  piVar6 = ring_buffer<int>::rat(local_98,sVar19);
                  _Var10 = local_a8;
                  uVar20 = local_70;
                  if (iVar16 != *piVar6) {
                    uVar11 = (uint)local_60;
                    break;
                  }
                  uVar14 = uVar14 + 1;
                  sVar19 = sVar19 - 1;
                } while ((uVar12 & 0x7fffffff) != uVar14);
              }
              uVar13 = uVar11;
              pVar24.second.
              super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
              ._M_cur = (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                         )(_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                           )_Var10._M_cur;
              pVar24.first.
              super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
              ._M_cur = (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                         )*(_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                            *)_Var17.
                              super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                              ._M_cur;
            } while ((__node_type *)
                     *(_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                       *)_Var17.
                         super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                         ._M_cur != _Var10._M_cur);
            uVar14 = local_90;
            if (-1 < (int)uVar13) {
              uVar14 = (ulong)((int)uVar20 - uVar13);
              uVar13 = (uint)local_80;
              goto LAB_0020e6de;
            }
          }
          uVar20 = uVar20 + 1;
          local_a0 = local_a0 + 1;
        } while (uVar20 != uVar14);
        uVar13 = (uint)local_80;
        uVar14 = local_80 & 0xffffffff;
      }
LAB_0020e6de:
      if ((int)local_78[3] <= (int)uVar14) {
        puVar5 = local_78;
        if (1 < (int)uVar13) {
          uVar11 = uVar13 - 1;
          local_a8._M_cur = (__node_type *)(ulong)uVar11;
          local_40 = (ulong)uVar13;
          local_60 = 0;
          uVar18 = 1;
          p_Var15 = (_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                     *)0xffffffff;
          iVar16 = 0;
          uVar20 = 0;
          local_70 = uVar14;
          local_48 = uVar11;
          do {
            iVar3 = (int)uVar18;
            if ((long)iVar16 < (long)uVar18) {
              local_a0 = CONCAT44(local_a0._4_4_,iVar16);
              local_90 = CONCAT44(local_90._4_4_,uVar11);
              sVar19 = 0;
              local_88 = p_Var15;
              local_44 = (uint)uVar20;
              do {
                prVar2 = local_98;
                piVar6 = ring_buffer<int>::rat(local_98,sVar19);
                iVar16 = *piVar6;
                piVar6 = ring_buffer<int>::rat(prVar2,uVar18 + sVar19);
                if (iVar16 != *piVar6) {
                  iVar3 = (int)sVar19 - (int)local_88;
                  goto LAB_0020e85c;
                }
                sVar19 = sVar19 + 1;
              } while (uVar11 != sVar19);
              sVar19 = local_90 & 0xffffffff;
              iVar3 = (int)local_80;
LAB_0020e85c:
              iVar4 = (int)sVar19;
              iVar16 = iVar4;
              if ((int)local_70 < iVar4) {
                iVar16 = (int)local_70;
              }
              (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[(long)local_a8._M_cur - uVar18] = iVar16;
              uVar20 = (ulong)local_44;
              if (iVar4 != 0) {
                uVar20 = uVar18 & 0xffffffff;
              }
              p_Var15 = local_88;
              uVar14 = local_70;
              uVar11 = (uint)local_90;
              iVar16 = (int)local_a0;
              if (iVar4 != 0) {
                iVar16 = iVar3 + -1;
              }
            }
            else {
              piVar1 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              iVar4 = piVar1[(int)((local_48 - iVar3) + (uint)uVar20)];
              if (iVar16 - iVar3 < iVar4) {
                local_90 = CONCAT44(local_90._4_4_,uVar11);
                iVar4 = iVar16 + 1;
                if (iVar16 + 1 < (int)local_80) {
                  iVar4 = (int)local_80;
                }
                local_a0 = CONCAT44(local_a0._4_4_,iVar4 + -1);
                sVar19 = (long)iVar16;
                local_88 = p_Var15;
                do {
                  prVar2 = local_98;
                  i = sVar19 + 1;
                  if ((long)local_38 <= (long)i) goto LAB_0020e819;
                  piVar6 = ring_buffer<int>::rat(local_98,i);
                  iVar16 = *piVar6;
                  piVar6 = ring_buffer<int>::rat(prVar2,sVar19 + local_60);
                  sVar19 = i;
                } while (iVar16 == *piVar6);
                iVar4 = (int)i;
                local_a0 = CONCAT44(local_a0._4_4_,iVar4 + -1);
LAB_0020e819:
                iVar16 = iVar4 - iVar3;
                if ((int)local_70 < iVar4 - iVar3) {
                  iVar16 = (int)local_70;
                }
                (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[(long)local_a8._M_cur - uVar18] = iVar16;
                uVar20 = uVar18 & 0xffffffff;
                p_Var15 = local_88;
                uVar14 = local_70;
                uVar11 = (uint)local_90;
                iVar16 = (int)local_a0;
              }
              else {
                if ((int)uVar14 < iVar4) {
                  iVar4 = (int)uVar14;
                }
                piVar1[(long)local_a8._M_cur - uVar18] = iVar4;
              }
            }
            puVar5 = local_78;
            uVar18 = uVar18 + 1;
            uVar11 = uVar11 - 1;
            local_60 = local_60 + -1;
            p_Var15 = (_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                       *)((long)&p_Var15[-1]._M_single_bucket + 7);
          } while (uVar18 != local_40);
          if (1 < (int)local_80) {
            iVar16 = (int)local_80 + -2;
            p_Var21 = (__node_type *)0x0;
            do {
              iVar3 = *(int *)(*(long *)(puVar5 + 0x14) + (long)p_Var21 * 4);
              if ((int)puVar5[3] <= iVar3) {
                puVar7 = (uint *)ring_buffer<int>::rat(local_98,(long)iVar16);
                local_ac = *puVar7;
                iVar8 = std::
                        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(local_50,(key_type *)&local_ac);
                if ((iVar8.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
                     (__node_type *)0x0) ||
                   (*(int *)((long)iVar8.super__Node_iterator_base<std::pair<const_int,_int>,_false>
                                   ._M_cur + 0xc) < iVar3)) {
                  pmVar9 = std::__detail::
                           _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_50,(key_type *)&local_ac);
                  *pmVar9 = iVar3;
                }
              }
              p_Var21 = (__node_type *)((long)&(p_Var21->super__Hash_node_base)._M_nxt + 1);
              iVar16 = iVar16 + -1;
            } while (local_a8._M_cur != p_Var21);
          }
        }
        iVar16 = 0;
        if (1.000001 < (float)puVar5[2]) {
          fVar22 = logf((float)puVar5[2]);
          iVar16 = (int)(88.72284 / fVar22);
        }
        if (local_68->size != 0) {
          p_Var15 = (_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                     *)(local_78 + 6);
          uVar14 = 0;
          do {
            iVar8 = std::
                    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(local_50,&local_68->data[uVar14].id);
            if (iVar8.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur !=
                (__node_type *)0x0) {
              pVar24 = std::
                       _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                       ::equal_range(p_Var15,&local_68->data[uVar14].id);
              for (_Var10._M_cur =
                        (__node_type *)
                        pVar24.first.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                        ._M_cur;
                  (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                   )_Var10._M_cur !=
                  pVar24.second.
                  super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                  ._M_cur.
                  super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                  ; _Var10._M_cur = (__node_type *)((_Var10._M_cur)->super__Hash_node_base)._M_nxt)
              {
                if (*(long *)((long)&((_Var10._M_cur)->
                                     super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_storage._M_storage + 8) ==
                    *(long *)((long)&((_Var10._M_cur)->
                                     super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_storage._M_storage + 0x10)) goto LAB_0020ea1d;
              }
              iVar4 = *(int *)((long)iVar8.
                                     super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                     _M_cur + 0xc) - local_78[3];
              iVar3 = iVar16;
              if (iVar4 < iVar16) {
                iVar3 = iVar4;
              }
              if (iVar16 < 1) {
                iVar3 = iVar4;
              }
              local_98 = (ring_buffer<int> *)(double)(float)local_78[1];
              dVar23 = pow((double)(float)local_78[2],(double)iVar3);
              local_68->data[uVar14].logit =
                   local_68->data[uVar14].logit - (float)(dVar23 * (double)local_98);
            }
LAB_0020ea1d:
            uVar14 = uVar14 + 1;
          } while (uVar14 < local_68->size);
        }
        local_68->sorted = false;
      }
    }
  }
  return;
}

Assistant:

static void llama_sampler_dry_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_dry *) smpl->ctx;

    if (ctx->dry_multiplier == 0.0f || ctx->dry_base < 1.0f || ctx->dry_penalty_last_n == 0) {
        return;
    }

    int32_t effective_dry_penalty_last_n = (ctx->dry_penalty_last_n == -1) ? ctx->total_context_size : std::max(ctx->dry_penalty_last_n, 0);
    int last_n_repeat = std::min(std::min((int)ctx->last_tokens.size(), effective_dry_penalty_last_n), ctx->total_context_size);

    if (last_n_repeat <= ctx->dry_allowed_length) {
        return;
    }

    ctx->dry_repeat_count.assign(last_n_repeat, 0);
    ctx->dry_max_token_repeat.clear();

    // Step 1: Look for restart sequences to limit the maximum repetition length.
    // Work backwards through the context looking for any token that begins a restart sequence.
    //
    // The collection `restart_sequences` is a mapping from a "head" token to all "tail"
    // sequences that together comprise a restart sequence. This allows us to quickly check
    // whether each token is the head of a complete sequence. Most restart sequences are actually
    // a single token, and for these the "tail" is an empty vector.
    //
    // If the token is a "head", test all restart sequences that begin with this token
    // (there will often only be one sequence for each token, but if sequences like 'aaaq1' and
    // 'aaa1' are used as restart strings, both could start with 'aaa' when tokenized). The
    // longest matching sequence (if any) is used to limit the maximum repetition length.
    //
    // Note that in the case case of a short sequence contained in a longer one, this might fail to
    // find the smallest value for `rep_limit`. For example, if 'amniotic' and 'ni' are both used as
    // restart sequences, 'ni' will be found first, and since it's shorter it will fail to suppress
    // 'otic'. This is a minor issue since fully contained restart sequences are likely to be rare.
    //
    // This is theoretically worst-case O(N^2) for arbitrary restart sequences, which is why we
    // have already clamped the maximum tail sequence length when generating `restart_sequences`.
    // With clamping, this scan is O(N) in the context length.

    int rep_limit = last_n_repeat;
    for (int i = 0; i < last_n_repeat; ++i) {
        llama_token token = ctx->last_tokens.rat(i);
        auto its = ctx->dry_processed_breakers.equal_range(token);
        if (its.first == ctx->dry_processed_breakers.end()) {
            continue;
        }
        int longest_match = -1;
        for (auto it = its.first; it != its.second; ++it) {
            // Note that (*it) does not contain the head character, so seq_len will be
            // the restart sequence length minus 1.
            // In the common case of a single-token restart sequence, (*it) will be empty
            // and we will trivially match.
            int seq_len = (int)it->second.size();
            if (seq_len > longest_match && seq_len <= (int)i) {
                bool match = true;
                for (int offset = 0; offset < seq_len; ++offset) {
                    // The -1 when indexing `last_tokens` is because we already matched the head.
                    if (it->second[offset] != ctx->last_tokens.rat(i - offset - 1)) {
                        match = false;
                        break;
                    }
                }
                if (match) {
                    longest_match = seq_len;
                }
            }
        }
        if (longest_match >= 0) {
            // We found a restart sequence starting `i` tokens from the end and continuing for
            // `longest_match` tokens.
            rep_limit = i - longest_match;
            break;
        }
    }
    if (rep_limit < ctx->dry_allowed_length) {
        return;
    }

    // Step 2: Iterate in reverse over the last N tokens of the context, using the "Z-algorithm" (in
    // the reverse direction) to efficiently compute the positions and lengths of suffixes appearing
    // elsewhere in the context. We limit the suffix length to `rep_limit` to respect restart sequences.
    //
    // This algorithm is not currently documented on Wikipedia, but there is a clear description here:
    // https://ivanyu.me/blog/2014/10/15/z-algorithm/
    //
    // The code below is adapted from the public domain implementation by the same author here:
    // https://github.com/ivanyu/string-algorithms/blob/master/z_algorithm.py
    //
    // Example:
    // Last N tokens: a b c c b c y a b c
    // Repeat counts: 0 0 3 1 0 2 0 0 0 0
    //                    ^
    //   This `3` means that the last three tokens of the context (a b c) also appear here.
    //
    // This step is worst case O(N) since the Z-algorithm is linear, despite the appearance of nested
    // for/while loops. This can be seen by observing that the `lt` and `rt` bounds are set after each
    // repeated suffix is detected (i.e. after each while loop when n > 0). These bound variables
    // ensure that the inner while loops only examine each token in the context once as the outer
    // for loop iterates over the context.

    {
        const int last = last_n_repeat - 1;
        int rt = 0, lt = 0;

        for (int k = 1; k < last_n_repeat; ++k) {
            if (k > rt) {
                // If k is outside the current Z-box, do naive computation.
                int n = 0;
                while (n + k < last_n_repeat && ctx->last_tokens.rat(n) == ctx->last_tokens.rat(n+k)) {
                    ++n;
                }
                ctx->dry_repeat_count[last - k] = std::min(n, rep_limit);
                if (n > 0) {
                    lt = k;
                    rt = k + n - 1;
                }
            } else {
                // If k is inside the current Z-box, consider two cases.

                int p = k - lt; // Pair index.
                int right_part_len = rt - k + 1;

                if (ctx->dry_repeat_count[last - p] < right_part_len) {
                    int n = std::min(ctx->dry_repeat_count[last - p], rep_limit);
                    ctx->dry_repeat_count[last - k] = n;
                } else {
                    int i = rt + 1;
                    while (i < last_n_repeat && ctx->last_tokens.rat(i) == ctx->last_tokens.rat(i - k)) {
                        i += 1;
                    }

                    int n = std::min(i - k, rep_limit);
                    ctx->dry_repeat_count[last - k] = n;
                    lt = k;
                    rt = i - 1;
                }
            }
        }
    }

    // Step 3: Iterate over dry_repeat_count and last_tokens, examining the maximum repeat length
    // that would be generated by emitting each new token that would extend a sequence.
    //
    // Following the same example as above:
    // Last N tokens: a b c c b c y a b c
    // Repeat counts: 0 0 3 1 0 2 0 0 0 0
    //
    // For each non-zero, look ahead one token. This token, if emitted, would extend the repetition.
    // c: 3 -> 4 (from `a b c` to `a b c c`)
    // b: 1 -> 2 (from `c` to `c b`)
    // y: 2 -> 3 (from `b c` to `b c y`)

    for (int i = 0; i < last_n_repeat - 1; ++i) {
        int repeat_len = ctx->dry_repeat_count[i];
        if (repeat_len >= ctx->dry_allowed_length) {
            // This token ends a repeat, so the next token would continue one.
            // By convention, the value of `repeat_len` only includes the tokens currently
            // in the context, not the new token that would be added.
            llama_token token = ctx->last_tokens.rat(last_n_repeat - 2 - i);
            // Track the maximum sequence ending in this token.
            const auto& it = ctx->dry_max_token_repeat.find(token);
            if (it == ctx->dry_max_token_repeat.end() || it->second < repeat_len) {
                ctx->dry_max_token_repeat[token] = repeat_len;
            }
        }
    }

    // Step 4: Apply logit penalties based on the maximum repeat length for relevant tokens.

    // Prevent floating point overflow in `pow(penalty_base, exponent)` by clamping to `max_exponent`.
    // Compute it from `penalty_base` and the approximate log of `std::numeric_limits<float>::max()`
    const float FLOAT_MAX_LOG = 88.7228391f;
    int max_exponent = 0;
    if (ctx->dry_base > 1.000001f) {
        max_exponent = FLOAT_MAX_LOG / std::log(ctx->dry_base);
    }

    for (size_t i = 0; i < cur_p->size; ++i) {
        const auto& af_kvp = ctx->dry_max_token_repeat.find(cur_p->data[i].id);
        if (af_kvp != ctx->dry_max_token_repeat.end()) {
            // Check all sequence breakers starting with this token
            auto range = ctx->dry_processed_breakers.equal_range(cur_p->data[i].id);
            bool is_single_token_breaker = false;

            for (auto it = range.first; it != range.second; ++it) {
                if (it->second.empty()) {
                    is_single_token_breaker = true;
                    break;
                }
            }

            // Apply penalty only if it's not a single-token sequence breaker
            if (!is_single_token_breaker) {
                int repeat_exp = af_kvp->second - ctx->dry_allowed_length;
                if (max_exponent > 0 && repeat_exp > max_exponent) {
                    repeat_exp = max_exponent;
                }
                float penalty = ctx->dry_multiplier * std::pow(ctx->dry_base, repeat_exp);
                cur_p->data[i].logit -= penalty;
            }
        }
    }

    cur_p->sorted = false;
}